

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_tweak_mul(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *tweak32)

{
  int iVar1;
  secp256k1_scalar *in_RDX;
  secp256k1_ge *in_RSI;
  long in_RDI;
  int overflow;
  int ret;
  secp256k1_scalar factor;
  secp256k1_ge p;
  uint7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  undefined1 uVar2;
  int iVar3;
  uint uVar4;
  secp256k1_context *in_stack_ffffffffffffff58;
  secp256k1_scalar *in_stack_ffffffffffffff60;
  uint local_4;
  
  uVar4 = 0;
  iVar3 = 0;
  if (in_RDI != 0) {
    if (in_RSI == (secp256k1_ge *)0x0) {
      secp256k1_callback_call
                ((secp256k1_callback *)0x0,
                 (char *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
      local_4 = 0;
    }
    else if (in_RDX == (secp256k1_scalar *)0x0) {
      secp256k1_callback_call
                ((secp256k1_callback *)0x0,
                 (char *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
      local_4 = 0;
    }
    else {
      secp256k1_scalar_set_b32
                (in_stack_ffffffffffffff60,(uchar *)in_stack_ffffffffffffff58,(int *)0x0);
      uVar2 = false;
      if (iVar3 == 0) {
        iVar1 = secp256k1_pubkey_load
                          (in_stack_ffffffffffffff58,(secp256k1_ge *)((ulong)uVar4 << 0x20),
                           (secp256k1_pubkey *)(ulong)in_stack_ffffffffffffff48);
        uVar2 = iVar1 != 0;
      }
      local_4 = (uint)(byte)uVar2;
      memset(in_RSI,0,0x40);
      if (local_4 != 0) {
        iVar1 = secp256k1_eckey_pubkey_tweak_mul(in_RSI,in_RDX);
        if (iVar1 == 0) {
          local_4 = 0;
        }
        else {
          secp256k1_pubkey_save
                    ((secp256k1_pubkey *)CONCAT44(local_4,iVar3),
                     (secp256k1_ge *)CONCAT17(uVar2,in_stack_ffffffffffffff48));
        }
      }
    }
    return local_4;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/secp256k1.c"
          ,0x2e5,"test condition failed: ctx != NULL");
  abort();
}

Assistant:

int secp256k1_ec_pubkey_tweak_mul(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const unsigned char *tweak32) {
    secp256k1_ge p;
    secp256k1_scalar factor;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(tweak32 != NULL);

    secp256k1_scalar_set_b32(&factor, tweak32, &overflow);
    ret = !overflow && secp256k1_pubkey_load(ctx, &p, pubkey);
    memset(pubkey, 0, sizeof(*pubkey));
    if (ret) {
        if (secp256k1_eckey_pubkey_tweak_mul(&p, &factor)) {
            secp256k1_pubkey_save(pubkey, &p);
        } else {
            ret = 0;
        }
    }

    return ret;
}